

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_minimum_duration.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  Result RVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string local_1ea0;
  double local_1e80;
  _Storage<double,_true> local_1e78;
  _Storage<double,_true> _Stack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined1 local_1d48 [8];
  OutputParameter<3UL,_ruckig::StandardVector> output;
  undefined1 local_1bf0 [8];
  InputParameter<3UL,_ruckig::StandardVector> input;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged,0.01);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1bf0);
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::OutputParameter<3UL,_0>
            ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d48);
  local_1d68 = 0;
  uStack_1d60 = 0;
  local_1d58 = 0x3fe0000000000000;
  input.current_position._M_elems[1] = 0.5;
  input.duration_discretization = Continuous;
  input._20_4_ = 0;
  input.current_position._M_elems[0] = 0.0;
  local_1d78 = 0xbfe0000000000000;
  local_1d88 = 0;
  uStack_1d80 = 0xc00199999999999a;
  input.current_velocity._M_elems[1] = -0.5;
  input.current_position._M_elems[2] = 0.0;
  input.current_velocity._M_elems[0] = -2.2;
  local_1d98 = 0xbfe0000000000000;
  local_1da8 = 0;
  uStack_1da0 = 0x4004000000000000;
  input.current_acceleration._M_elems[1] = -0.5;
  input.current_velocity._M_elems[2] = 0.0;
  input.current_acceleration._M_elems[0] = 2.5;
  local_1db8 = 0xc00c000000000000;
  local_1dc8 = 0xc014000000000000;
  uStack_1dc0 = 0xc000000000000000;
  input.target_position._M_elems[1] = -3.5;
  input.current_acceleration._M_elems[2] = -5.0;
  input.target_position._M_elems[0] = -2.0;
  local_1dd8 = 0xc000000000000000;
  local_1de8 = 0;
  uStack_1de0 = 0xbfe0000000000000;
  uVar4 = 0;
  input.target_velocity._M_elems[1] = -2.0;
  input.target_position._M_elems[2] = 0.0;
  input.target_velocity._M_elems[0] = -0.5;
  local_1df8 = 0x3fe0000000000000;
  local_1e08 = 0;
  uStack_1e00 = 0;
  input.target_acceleration._M_elems[1] = 0.5;
  input.target_velocity._M_elems[2] = 0.0;
  input.target_acceleration._M_elems[0] = 0.0;
  local_1e18 = 0x4008000000000000;
  local_1e28 = 0x4008000000000000;
  uStack_1e20 = 0x3ff0000000000000;
  input.max_velocity._M_elems[1] = 3.0;
  input.target_acceleration._M_elems[2] = 3.0;
  input.max_velocity._M_elems[0] = 1.0;
  local_1e38 = 0x3ff0000000000000;
  local_1e48 = 0x4008000000000000;
  uStack_1e40 = 0x4000000000000000;
  input.max_acceleration._M_elems[1] = 1.0;
  input.max_velocity._M_elems[2] = 3.0;
  input.max_acceleration._M_elems[0] = 2.0;
  local_1e58 = 0x4000000000000000;
  local_1e68 = 0x4010000000000000;
  uStack_1e60 = 0x4008000000000000;
  input.max_jerk._M_elems[1] = 2.0;
  input.max_acceleration._M_elems[2] = 4.0;
  input.max_jerk._M_elems[0] = 3.0;
  local_1e80 = 5.0;
  std::optional<double>::optional<double,_true>((optional<double> *)&local_1e78,&local_1e80);
  input._648_8_ = local_1e78;
  input.minimum_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload = _Stack_1e70;
  poVar3 = std::operator<<((ostream *)&std::cout,"t | position");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    RVar2 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
                      ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
                       &input.interrupt_calculation_duration.
                        super__Optional_base<double,_true,_true>._M_payload.
                        super__Optional_payload_base<double>._M_engaged,
                       (InputParameter<3UL,_ruckig::StandardVector> *)local_1bf0,
                       (OutputParameter<3UL,_ruckig::StandardVector> *)local_1d48);
    if (RVar2 != Working) break;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,output.new_jerk._M_elems[2]);
    poVar3 = std::operator<<(poVar3," | ");
    ruckig::join<std::array<double,3ul>>
              (&local_1ea0,(ruckig *)&output.trajectory.degrees_of_freedom,(array<double,_3UL> *)0x0
               ,SUB81(uVar4,0));
    poVar3 = std::operator<<(poVar3,(string *)&local_1ea0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1ea0);
    ruckig::OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input
              ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d48,
               (InputParameter<3UL,_ruckig::StandardVector> *)local_1bf0);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Trajectory duration: ");
  dVar1 = ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_duration
                    ((Trajectory<3UL,_ruckig::StandardVector> *)&output);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3," [s].");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  ruckig::OutputParameter<3UL,_ruckig::StandardVector>::~OutputParameter
            ((OutputParameter<3UL,_ruckig::StandardVector> *)local_1d48);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1bf0);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)
             &input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>._M_engaged);
  return 0;
}

Assistant:

int main() {
    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<3> otg(0.01);  // control cycle
    InputParameter<3> input;
    OutputParameter<3> output;

    // Set input parameters
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {-5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set minimum duration (equals the trajectory duration when target velocity and acceleration are zero)
    input.minimum_duration = 5.0;

    // Generate the trajectory within the control loop
    std::cout << "t | position" << std::endl;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }

    std::cout << "Trajectory duration: " << output.trajectory.get_duration() << " [s]." << std::endl;
}